

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_fibre_channel_speed(tcv_t *tcv,fibre_channel_speed_t *speed)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((speed != (fibre_channel_speed_t *)0x0 && tcv != (tcv_t *)0x0) && (tcv->data != (void *)0x0))
  {
    speed->bmp = '\0';
    bVar1 = *(byte *)((long)tcv->data + 10) >> 1 & 0x7e;
    speed->bmp = bVar1;
    speed->bmp = *(byte *)((long)tcv->data + 10) & 1 | bVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sfp_get_fibre_channel_speed(tcv_t *tcv, fibre_channel_speed_t *speed)
{
	if (tcv == NULL || speed == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	speed->bmp = 0;

	/* Fill bitmap */
	speed->bmp |= (((sfp_data_t*)tcv->data)->a0[MEDIA_REG] & MEDIA_MASK_1) >> 1;
	speed->bmp |= ((sfp_data_t*)tcv->data)->a0[MEDIA_REG] & MEDIA_MASK_2;

	return 0;
}